

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skills.c
# Opt level: O3

void check_improve(CHAR_DATA *ch,int sn,bool success,int multiplier)

{
  short *psVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  CClass *this;
  short sVar6;
  short sVar7;
  char *pcVar8;
  long lVar9;
  float fVar10;
  char buf [100];
  float local_9c;
  char local_98 [104];
  
  bVar3 = is_npc(ch);
  if (bVar3) {
    return;
  }
  bVar3 = is_affected_by(ch,0x16);
  if (bVar3) {
    return;
  }
  sVar7 = ch->level;
  lVar9 = (long)sn;
  this = ch->my_class;
  if ((this == (CClass *)0x0) &&
     ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
      (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
    this = CClass::GetClass(0);
  }
  iVar4 = CClass::GetIndex(this);
  if (sVar7 < *(short *)(lVar9 * 0x60 + 0x44e788 + (long)iVar4 * 2)) {
    return;
  }
  if ((ushort)(ch->pcdata->learned[lVar9] - 100U) < 0xffa7) {
    return;
  }
  iVar4 = get_curr_stat(ch,1);
  local_9c = (float)(ch->level * 2) +
             (float)((int)int_app[iVar4].learn << 3) / (float)(multiplier << 2);
  if (((uint)ch->act[0] >> 0x15 & 1) != 0) {
    local_9c = local_9c * 0.25;
  }
  bVar3 = is_affected(ch,(int)gsn_synaptic_enhancement);
  if (bVar3) {
    local_9c = local_9c * 1.5;
  }
  bVar3 = is_affected(ch,(int)gsn_synaptic_impairment);
  if (bVar3) {
    local_9c = local_9c * 0.5;
  }
  iVar4 = number_range(1,1000);
  if (local_9c < (float)iVar4) {
    return;
  }
  uVar2 = ch->pcdata->learned[lVar9];
  if (!success) {
    if ((short)uVar2 < 10) {
      fVar10 = 5.0;
    }
    else if (uVar2 < 0x3e) {
      fVar10 = (float)((int)(short)(uVar2 - ((short)uVar2 >> 0xf)) >> 1);
    }
    else {
      fVar10 = 30.0;
    }
    iVar4 = number_range(1,3);
    iVar5 = number_percent();
    if (fVar10 <= (float)iVar5) {
      return;
    }
    iVar5 = ch->pcdata->learned[lVar9] + iVar4;
    if ((ch->comm[0] & 0x400) == 0) {
      if (iVar5 < 100) {
        pcVar8 = "You learn from your mistakes, and your %s skill improves.\n\r";
        goto LAB_002bef09;
      }
      if (iVar5 == 100) {
        pcVar8 = "You learn from your mistakes, and manage to perfect %s!\n\r";
        goto LAB_002bef09;
      }
    }
    else {
      if (iVar5 < 100) {
        pcVar8 = "\x1b[1;33mYou learn from your mistakes, and your %s skill improves.\x1b[0m\n\r";
      }
      else {
        if (iVar5 != 100) goto LAB_002bef19;
        pcVar8 = "\x1b[1;33mYou learn from your mistakes, and manage to perfect %s!\x1b[0m\n\r";
      }
LAB_002bef09:
      sprintf(local_98,pcVar8,skill_table[lVar9].name);
    }
LAB_002bef19:
    send_to_char(local_98,ch);
    sVar6 = ch->pcdata->learned[lVar9] + (short)iVar4;
    sVar7 = 100;
    if (sVar6 < 100) {
      sVar7 = sVar6;
    }
    ch->pcdata->learned[lVar9] = sVar7;
    goto LAB_002bef4e;
  }
  if ((short)uVar2 < 0x60) {
    if ((short)uVar2 < 5) {
      fVar10 = 95.0;
    }
    else {
      fVar10 = (float)(100 - (short)uVar2);
    }
  }
  else {
    fVar10 = 5.0;
  }
  iVar4 = number_percent();
  if (fVar10 <= (float)iVar4) {
    return;
  }
  sVar7 = ch->pcdata->learned[lVar9];
  if ((ch->comm[0] & 0x400) == 0) {
    if (sVar7 < 99) {
      pcVar8 = "You have become better at %s!\n\r";
      goto LAB_002beed1;
    }
    if (sVar7 == 99) {
      pcVar8 = "You have perfected %s!\n\r";
      goto LAB_002beed1;
    }
  }
  else {
    if (sVar7 < 99) {
      pcVar8 = "\x1b[1;33mYou have become better at %s!\x1b[0m\n\r";
    }
    else {
      if (sVar7 != 99) goto LAB_002beee1;
      pcVar8 = "\x1b[1;33mYou have perfected %s!\x1b[0m\n\r";
    }
LAB_002beed1:
    sprintf(local_98,pcVar8,skill_table[lVar9].name);
  }
LAB_002beee1:
  send_to_char(local_98,ch);
  psVar1 = ch->pcdata->learned + lVar9;
  *psVar1 = *psVar1 + 1;
LAB_002bef4e:
  gain_exp(ch,4);
  return;
}

Assistant:

void check_improve(CHAR_DATA *ch, int sn, bool success, int multiplier)
{
	int inum;
	float chance;
	char buf[100];

	if (is_npc(ch))
		return;

	if (is_affected_by(ch, AFF_CALM))
		return;

	if (ch->level < skill_table[sn].skill_level[ch->Class()->GetIndex()]
		|| ch->pcdata->learned[sn] <= 10
		|| ch->pcdata->learned[sn] >= 100)
	{
		return; /* skill is not known */
	}

	/* check to see if the character has a chance to learn */
	chance = 8 * int_app[get_curr_stat(ch, STAT_INT)].learn;
	chance /= (multiplier * 4);
	chance += ch->level * 2;

	if (IS_SET(ch->act, PLR_MORON))
		chance /= 4;

	if (is_affected(ch, gsn_synaptic_enhancement))
		chance *= 1.5;

	if (is_affected(ch, gsn_synaptic_impairment))
		chance /= 2;

	if (number_range(1, 1000) > chance)
		return;

	/* now that the character has a CHANCE to learn, see if they really have */

	if (success)
	{
		chance = URANGE(5, 100 - ch->pcdata->learned[sn], 95);

		if (number_percent() < chance)
		{
			if (IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] < 99)
				sprintf(buf, "[1;33mYou have become better at %s![0m\n\r", skill_table[sn].name);
			else if (!IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] < 99)
				sprintf(buf, "You have become better at %s!\n\r", skill_table[sn].name);
			else if (IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] == 99)
				sprintf(buf, "[1;33mYou have perfected %s![0m\n\r", skill_table[sn].name);
			else if (!IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] == 99)
				sprintf(buf, "You have perfected %s!\n\r", skill_table[sn].name);

			send_to_char(buf, ch);
			ch->pcdata->learned[sn]++;
			gain_exp(ch, 4);
		}
	}
	else
	{
		chance = URANGE(5, ch->pcdata->learned[sn] / 2, 30);
		inum = number_range(1, 3);

		if (number_percent() < chance)
		{
			if (IS_SET(ch->comm, COMM_ANSI) && (ch->pcdata->learned[sn] + inum) < 100)
				sprintf(buf, "[1;33mYou learn from your mistakes, and your %s skill improves.[0m\n\r", skill_table[sn].name);
			else if (!IS_SET(ch->comm, COMM_ANSI) && (ch->pcdata->learned[sn] + inum) < 100)
				sprintf(buf, "You learn from your mistakes, and your %s skill improves.\n\r", skill_table[sn].name);
			else if (IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] + inum == 100)
				sprintf(buf, "[1;33mYou learn from your mistakes, and manage to perfect %s![0m\n\r", skill_table[sn].name);
			else if (!IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] + inum == 100)
				sprintf(buf, "You learn from your mistakes, and manage to perfect %s!\n\r", skill_table[sn].name);

			send_to_char(buf, ch);
			ch->pcdata->learned[sn] += inum;
			ch->pcdata->learned[sn] = std::min((int)ch->pcdata->learned[sn], 100);
			gain_exp(ch, 4);
		}
	}
}